

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_mem.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  long *plVar7;
  int iVar8;
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> ranges;
  elfio elffile;
  ifstream proc_maps;
  string local_338;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8 [2];
  long local_2e8 [2];
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> local_2d8;
  undefined1 local_2b8 [88];
  address_translator local_260 [2];
  long local_230 [4];
  byte abStack_210 [488];
  
  if (argc == 3) {
    local_318 = &local_308;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"/proc/","");
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_318);
    paVar1 = &local_338.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338.field_2._8_8_ = plVar4[3];
      local_338._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar6;
      local_338._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_338._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_338);
    pcVar2 = local_2b8 + 0x10;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_2b8._16_8_ = *psVar6;
      local_2b8._24_8_ = plVar4[3];
      local_2b8._0_8_ = pcVar2;
    }
    else {
      local_2b8._16_8_ = *psVar6;
      local_2b8._0_8_ = (size_type *)*plVar4;
    }
    local_2b8._8_8_ = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::ifstream::ifstream(local_230,(string *)local_2b8,_S_in);
    if ((char *)local_2b8._0_8_ != pcVar2) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
      local_2d8.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2b8,argv[2],(allocator<char> *)&local_338);
      get_translation_ranges((ifstream *)local_230,(string *)local_2b8,&local_2d8);
      if ((char *)local_2b8._0_8_ != pcVar2) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      ELFIO::elfio::elfio((elfio *)local_2b8);
      ELFIO::address_translator::set_address_translation(local_260,&local_2d8);
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"/proc/","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_2f8);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_308 = *plVar7;
        lStack_300 = plVar4[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *plVar7;
        local_318 = (long *)*plVar4;
      }
      local_310 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_318);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_338.field_2._M_allocated_capacity = *psVar6;
        local_338.field_2._8_8_ = plVar4[3];
        local_338._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_338.field_2._M_allocated_capacity = *psVar6;
        local_338._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_338._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      bVar3 = ELFIO::elfio::load((elfio *)local_2b8,&local_338,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar1) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318,local_308 + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      if (bVar3) {
        ELFIO::dump::header((ostream *)&std::cout,(elfio *)local_2b8);
        ELFIO::dump::segment_headers((ostream *)&std::cout,(elfio *)local_2b8);
        ELFIO::dump::segment_datas((ostream *)&std::cout,(elfio *)local_2b8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can\'t open ",0xb)
        ;
        local_2f8[0] = local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"/proc/","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_2f8);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_308 = *plVar7;
          lStack_300 = plVar4[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *plVar7;
          local_318 = (long *)*plVar4;
        }
        local_310 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_318);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_338.field_2._M_allocated_capacity = *psVar6;
          local_338.field_2._8_8_ = plVar4[3];
          local_338._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_338.field_2._M_allocated_capacity = *psVar6;
          local_338._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_338._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_338._M_dataplus._M_p,
                            local_338._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," file",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar1) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if (local_2f8[0] != local_2e8) {
          operator_delete(local_2f8[0],local_2e8[0] + 1);
        }
      }
      ELFIO::elfio::~elfio((elfio *)local_2b8);
      if (local_2d8.
          super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.
                        super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d8.
                              super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.
                              super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar8 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can\'t open ",0xb);
      local_318 = &local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"/proc/","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_318);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_338.field_2._M_allocated_capacity = *psVar6;
        local_338.field_2._8_8_ = plVar4[3];
        local_338._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_338.field_2._M_allocated_capacity = *psVar6;
        local_338._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_338._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_338);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar6) {
        local_2b8._16_8_ = *psVar6;
        local_2b8._24_8_ = plVar4[3];
        local_2b8._0_8_ = pcVar2;
      }
      else {
        local_2b8._16_8_ = *psVar6;
        local_2b8._0_8_ = (size_type *)*plVar4;
      }
      local_2b8._8_8_ = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_2b8._0_8_,local_2b8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," file",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((char *)local_2b8._0_8_ != pcVar2) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar1) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318,local_308 + 1);
      }
      iVar8 = 2;
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: proc_mem <pid> <full_file_path>",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 3 ) {
        std::cout << "Usage: proc_mem <pid> <full_file_path>" << std::endl;
        return 1;
    }

    // Process file translation regions for the ELF file from /proc/pid/maps
    std::ifstream proc_maps( std::string( "/proc/" ) + argv[1] + "/maps" );
    if ( !proc_maps ) {
        std::cout << "Can't open "
                  << std::string( "/proc/" ) + argv[1] + "/maps" << " file"
                  << std::endl;
        return 2;
    }

    // Retrieve memory address translation ranges
    std::vector<address_translation> ranges;
    get_translation_ranges( proc_maps, argv[2], ranges );

    // Set address translation ranges prior loading ELF file
    elfio elffile;
    elffile.set_address_translation( ranges );

    // The 'load' will use the provided address translation now
    if ( elffile.load( std::string( "/proc/" ) + argv[1] + "/mem", true ) ) {
        dump::header( std::cout, elffile );
        dump::segment_headers( std::cout, elffile );
        dump::segment_datas( std::cout, elffile );
    }
    else {
        std::cout << "Can't open " << std::string( "/proc/" ) + argv[1] + "/mem"
                  << " file" << std::endl;
    }

    return 0;
}